

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFStream.cpp
# Opt level: O0

void __thiscall PDFStream::FlushStreamContentForDirectExtentStream(PDFStream *this)

{
  string local_68 [48];
  OutputStreamTraits local_38;
  OutputStreamTraits streamCopier;
  InputStringBufferStream inputStreamForWrite;
  PDFStream *this_local;
  
  std::operator|(_S_in,_S_out);
  std::streambuf::pubseekoff
            ((long)&this->mTemporaryStream,_S_beg,~(_S_ios_openmode_min|_S_ios_openmode_max));
  InputStringBufferStream::InputStringBufferStream
            ((InputStringBufferStream *)&streamCopier,&this->mTemporaryStream);
  OutputStreamTraits::OutputStreamTraits(&local_38,&this->mOutputStream->super_IByteWriter);
  OutputStreamTraits::CopyToOutputStream(&local_38,(IByteReader *)&streamCopier);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::~string(local_68);
  this->mOutputStream = (IByteWriterWithPosition *)0x0;
  OutputStreamTraits::~OutputStreamTraits(&local_38);
  InputStringBufferStream::~InputStringBufferStream((InputStringBufferStream *)&streamCopier);
  return;
}

Assistant:

void PDFStream::FlushStreamContentForDirectExtentStream()
{
    mTemporaryStream.pubseekoff(0,std::ios_base::beg);
    
    // copy internal temporary stream to output
    InputStringBufferStream inputStreamForWrite(&mTemporaryStream);
    OutputStreamTraits streamCopier(mOutputStream);
    streamCopier.CopyToOutputStream(&inputStreamForWrite);
    
    mTemporaryStream.str();
    mOutputStream = NULL;
}